

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall CVmObjStringBuffer::load_image_data(CVmObjStringBuffer *this,char *ptr,size_t siz)

{
  wchar_t wVar1;
  CVmVarHeap *pCVar2;
  unsigned_long uVar3;
  vm_strbuf_ext *pvVar4;
  void *in_RSI;
  long in_RDI;
  wchar_t *dst;
  vm_strbuf_ext *ext;
  uint32_t len;
  uint32_t inc;
  uint32_t alo;
  undefined8 in_stack_ffffffffffffffc8;
  wchar_t *pwVar5;
  CVmObjStringBuffer *in_stack_ffffffffffffffd0;
  uint local_24;
  uint local_1c;
  void *local_10;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
  }
  uVar3 = ::osrp4(in_RSI);
  local_1c = (uint)uVar3;
  ::osrp4((void *)((long)in_RSI + 4));
  uVar3 = ::osrp4((void *)((long)in_RSI + 8));
  local_24 = (uint)uVar3;
  if (local_1c < 0x10) {
    local_1c = 0x10;
  }
  else if (0x7fffffff < local_1c) {
    local_1c = 0x7fffffff;
  }
  if (local_1c < local_24) {
    local_24 = local_1c;
  }
  local_10 = (void *)((long)in_RSI + 0xc);
  pvVar4 = vm_strbuf_ext::alloc_ext
                     (in_stack_ffffffffffffffd0,(int32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                      (int32_t)in_stack_ffffffffffffffc8);
  *(vm_strbuf_ext **)(in_RDI + 8) = pvVar4;
  pvVar4->len = local_24;
  pwVar5 = pvVar4->buf;
  for (; local_24 != 0; local_24 = local_24 - 1) {
    wVar1 = ::osrp2(local_10);
    *pwVar5 = wVar1;
    local_10 = (void *)((long)local_10 + 2);
    pwVar5 = pwVar5 + 1;
  }
  return;
}

Assistant:

void CVmObjStringBuffer::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the string and allocation data from the image data */
    uint32_t alo = osrp4(ptr);
    uint32_t inc = osrp4(ptr + 4);
    uint32_t len = osrp4(ptr + 8);

    /* limit the sizes */
    if (alo < 16)
        alo = 16;
    else if (alo > STRBUF_MAX_LEN)
        alo = STRBUF_MAX_LEN;

    if (inc < 16)
        inc = 16;
    else if (inc > STRBUF_MAX_LEN)
        inc = STRBUF_MAX_LEN;

    if (len > alo)
        len = alo;

    /* skip to the string characters */
    ptr += 12;

    /* allocate the extension */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* set the length */
    ext->len = len;

    /* read the string data into the buffer */
    for (wchar_t *dst = ext->buf ; len != 0 ;
         *dst++ = osrp2(ptr), ptr += 2, --len) ;
}